

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalMultiplyOverflowCheck,bool>
               (short *ldata,short *rdata,short *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  short sVar2;
  short sVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  OutOfRangeException *pOVar12;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  idx_t iVar15;
  int iVar16;
  idx_t iVar17;
  idx_t iVar18;
  string local_78;
  buffer_ptr<ValidityBuffer> *local_50;
  short *local_48;
  short *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = lsel->sel_vector;
      psVar5 = rsel->sel_vector;
      iVar15 = 0;
      do {
        iVar17 = iVar15;
        if (psVar4 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar4[iVar15];
        }
        iVar18 = iVar15;
        if (psVar5 != (sel_t *)0x0) {
          iVar18 = (idx_t)psVar5[iVar15];
        }
        sVar2 = ldata[iVar17];
        sVar3 = rdata[iVar18];
        iVar16 = (int)sVar3 * (int)sVar2;
        if (0x4e1e < iVar16 + 9999U) {
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<short,short>(pOVar12,&local_78,sVar2,sVar3);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[iVar15] = (short)iVar16;
        iVar15 = iVar15 + 1;
      } while (count != iVar15);
    }
  }
  else if (count != 0) {
    psVar4 = lsel->sel_vector;
    psVar5 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_48 = rdata;
    local_40 = ldata;
    do {
      uVar10 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar4[uVar14];
      }
      uVar13 = uVar14;
      if (psVar5 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar5[uVar14];
      }
      puVar6 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && ((puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))
         ) {
        sVar2 = ldata[uVar10];
        sVar3 = rdata[uVar13];
        iVar16 = (int)sVar3 * (int)sVar2;
        if (0x4e1e < iVar16 + 9999U) {
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<short,short>(pOVar12,&local_78,sVar2,sVar3);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[uVar14] = (short)iVar16;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          sVar9 = local_78._M_string_length;
          _Var8._M_p = local_78._M_dataplus._M_p;
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_78._M_string_length = 0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var8._M_p;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar9;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          rdata = local_48;
          ldata = local_40;
        }
        bVar7 = (byte)uVar14 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar14 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar14 = uVar14 + 1;
    } while (count != uVar14);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}